

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNDepartureSetFactory<wchar_t>::closure_add
          (CATNDepartureSetFactory<wchar_t> *this,CATNClosure *closure,
          CATNDeparture<wchar_t> *departure)

{
  _Rb_tree_header *p_Var1;
  PriorityChain *__args_2;
  bool bVar2;
  _Base_ptr p_Var3;
  iterator __position;
  _Self __tmp;
  int local_2c;
  
  p_Var3 = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(closure->_M_t)._M_impl.super__Rb_tree_header;
  __args_2 = &departure->m_priority;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      __position._M_node = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)__position._M_node != p_Var1) {
        bVar2 = PriorityChain::is_superior_to
                          (__args_2,(PriorityChain *)&__position._M_node[2]._M_parent);
        if (bVar2) {
          __position = std::
                       _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                       ::erase_abi_cxx11_((_Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                                           *)closure,__position._M_node);
        }
        else {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
      }
      local_2c = departure->m_color;
      std::
      _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
      ::_M_emplace_unique<Centaurus::ATNPath_const&,int,Centaurus::PriorityChain_const&>
                ((_Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                  *)closure,&departure->m_path,&local_2c,__args_2);
      return;
    }
    bVar2 = PriorityChain::is_inferior_to(__args_2,(PriorityChain *)&p_Var3[2]._M_parent);
    if (bVar2) break;
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  }
  return;
}

Assistant:

void closure_add(CATNClosure& closure, const CATNDeparture<TCHAR>& departure) const
    {
        for (auto i = closure.cbegin(); i != closure.cend(); i++)
        {
            if (departure.priority().is_inferior_to(i->priority()))
            {
                //std::wcerr << L"Departure " << departure.label() << L":" << departure.priority() << L" by " << i->label() << L":" << i->priority() << std::endl;
                return;
            }
        }
        for (auto i = closure.begin(); i != closure.end();)
        {
            if (departure.priority().is_superior_to(i->priority()))
            {
                //std::wcerr << L"Departure " << i->label() << L":" << i->priority() << L" expelled by " << departure.label() << L":" << departure.priority() << std::endl;
                i = closure.erase(i);
            }
            else
            {
                i++;
            }
        }
        closure.emplace(departure.path(), departure.color(), departure.priority());
    }